

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O0

void CallSignalWithoutConnections_SignalShouldBeCalled(void)

{
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int in_ESI;
  int __sig;
  undefined1 local_18 [3];
  bool paramTwo;
  int paramOne;
  signal<void_(int,_bool)> sg;
  
  TestRunner::StartTest("CallSignalWithoutConnections_SignalShouldBeCalled");
  lsignal::signal<void_(int,_bool)>::signal((signal<void_(int,_bool)> *)local_18,in_ESI,__handler);
  __sig = 7;
  lsignal::signal<void_(int,_bool)>::operator()((signal<void_(int,_bool)> *)local_18,7,true);
  lsignal::signal<void_(int,_bool)>::~signal
            ((signal<void_(int,_bool)> *)local_18,__sig,__handler_00);
  return;
}

Assistant:

void CallSignalWithoutConnections_SignalShouldBeCalled()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	sg(paramOne, paramTwo);
}